

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test::testBody
          (TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test *this)

{
  MemoryLeakDetector *pMVar1;
  TestMemoryAllocator *pTVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  UtestShell *pUVar7;
  SimpleString output;
  SimpleString local_30;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultNewAllocator();
  pcVar3 = MemoryLeakDetector::allocMemory(pMVar1,pTVar2,1,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultNewAllocator();
  pcVar4 = MemoryLeakDetector::allocMemory(pMVar1,pTVar2,2,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultNewAllocator();
  pcVar5 = MemoryLeakDetector::allocMemory(pMVar1,pTVar2,3,false);
  pcVar6 = MemoryLeakDetector::report
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      mem_leak_period_checking);
  SimpleString::SimpleString(&local_30,pcVar6);
  pUVar7 = UtestShell::getCurrent();
  pcVar6 = SimpleString::asCharString(&local_30);
  (*pUVar7->_vptr_UtestShell[0xc])
            (pUVar7,"Alloc num (1)",pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x9a);
  pUVar7 = UtestShell::getCurrent();
  pcVar6 = SimpleString::asCharString(&local_30);
  (*pUVar7->_vptr_UtestShell[0xc])
            (pUVar7,"Alloc num (2)",pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x9b);
  pUVar7 = UtestShell::getCurrent();
  pcVar6 = SimpleString::asCharString(&local_30);
  (*pUVar7->_vptr_UtestShell[0xc])
            (pUVar7,"Alloc num (3)",pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x9c);
  (*PlatformSpecificFree)(pcVar3);
  (*PlatformSpecificFree)(pcVar4);
  (*PlatformSpecificFree)(pcVar5);
  SimpleString::~SimpleString(&local_30);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, sequenceNumbersOfMemoryLeaks)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 1);
    char* mem2 = detector->allocMemory(defaultNewAllocator(), 2);
    char* mem3 = detector->allocMemory(defaultNewAllocator(), 3);
    SimpleString output = detector->report(mem_leak_period_checking);

    STRCMP_CONTAINS("Alloc num (1)", output.asCharString());
    STRCMP_CONTAINS("Alloc num (2)", output.asCharString());
    STRCMP_CONTAINS("Alloc num (3)", output.asCharString());

    PlatformSpecificFree(mem);
    PlatformSpecificFree(mem2);
    PlatformSpecificFree(mem3);
}